

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cpp
# Opt level: O2

UCTNode * megumax::expand(Position *pos,UCTNode *selected_node)

{
  bool bVar1;
  uint uVar2;
  vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_> *pvVar3;
  Move *pMVar4;
  MoveList move_list;
  
  pvVar3 = UCTNode::children(selected_node);
  if ((pvVar3->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (pvVar3->super__Vector_base<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar1 = UCTNode::is_terminal(selected_node);
    if (!bVar1) {
      libchess::Position::legal_move_list(&move_list,pos);
      if (move_list.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          move_list.values_.super__Vector_base<libchess::Move,_std::allocator<libchess::Move>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        UCTNode::is_terminal(selected_node,true);
      }
      else {
        UCTNode::create_children(selected_node,pos,&move_list);
      }
      std::_Vector_base<libchess::Move,_std::allocator<libchess::Move>_>::~_Vector_base
                ((_Vector_base<libchess::Move,_std::allocator<libchess::Move>_> *)&move_list);
    }
  }
  else {
    uVar2 = UCTNode::visited_children(selected_node);
    UCTNode::increment_visited_children(selected_node);
    pvVar3 = UCTNode::children(selected_node);
    selected_node =
         std::vector<megumax::UCTNode,_std::allocator<megumax::UCTNode>_>::at(pvVar3,(ulong)uVar2);
    pMVar4 = UCTNode::move(selected_node);
    libchess::Position::make_move(pos,(Move)pMVar4->value_);
  }
  return selected_node;
}

Assistant:

UCTNode* expand(Position& pos, UCTNode* selected_node) {
    std::vector<UCTNode>& children = selected_node->children();
    if (children.empty()) {
        if (selected_node->is_terminal()) {
            return selected_node;
        }

        MoveList move_list = pos.legal_move_list();
        if (move_list.empty()) {
            selected_node->is_terminal(true);
            return selected_node;
        }

        selected_node->create_children(pos, move_list);

        return selected_node;
    }

    unsigned next_child_index = selected_node->visited_children();
    selected_node->increment_visited_children();
    UCTNode* next_child = &selected_node->children().at(next_child_index);
    assert(pos.is_legal_move(next_child->move()));
    pos.make_move(next_child->move());
    return next_child;
}